

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

float ImGui::TableGetHeaderRowHeight(void)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  char *text;
  ImGuiStyle *pIVar5;
  int column_n;
  int iVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar7 [64];
  undefined1 local_28 [16];
  undefined1 extraout_var [56];
  
  local_28._0_4_ = GetTextLineHeight();
  local_28._4_4_ = extraout_XMM0_Db;
  local_28._8_4_ = extraout_XMM0_Dc;
  local_28._12_4_ = extraout_XMM0_Dd;
  iVar6 = 0;
  if (GImGui->CurrentTable != (ImGuiTable *)0x0) {
    iVar6 = GImGui->CurrentTable->ColumnsCount;
  }
  column_n = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
    column_n = 0;
  }
  for (; iVar6 != column_n; column_n = column_n + 1) {
    uVar4 = TableGetColumnFlags(column_n);
    if ((uVar4 >> 0x14 & 1) != 0) {
      text = TableGetColumnName(column_n);
      auVar7._0_8_ = CalcTextSize(text,(char *)0x0,false,-1.0);
      auVar7._8_56_ = extraout_var;
      auVar3 = vmovshdup_avx(auVar7._0_16_);
      auVar2 = vcmpss_avx(auVar3,local_28,2);
      local_28 = vblendvps_avx(auVar3,local_28,auVar2);
    }
  }
  pIVar5 = GetStyle();
  fVar1 = (pIVar5->CellPadding).y;
  return fVar1 + fVar1 + (float)local_28._0_4_;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    float row_height = GetTextLineHeight();
    int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
        if (TableGetColumnFlags(column_n) & ImGuiTableColumnFlags_IsEnabled)
            row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(column_n)).y);
    row_height += GetStyle().CellPadding.y * 2.0f;
    return row_height;
}